

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O2

var * varcontent(GlobalConfig *global,char *name,size_t nlen)

{
  int iVar1;
  size_t sVar2;
  var *pvVar3;
  
  pvVar3 = (var *)&global->variables;
  do {
    pvVar3 = pvVar3->next;
    if (pvVar3 == (var *)0x0) {
      return (var *)0x0;
    }
    sVar2 = strlen(pvVar3->name);
  } while ((sVar2 != nlen) || (iVar1 = strncmp(name,pvVar3->name,nlen), iVar1 != 0));
  return pvVar3;
}

Assistant:

static const struct var *varcontent(struct GlobalConfig *global,
                                    const char *name, size_t nlen)
{
  struct var *list = global->variables;
  while(list) {
    if((strlen(list->name) == nlen) &&
       !strncmp(name, list->name, nlen)) {
      return list;
    }
    list = list->next;
  }
  return NULL;
}